

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_vfs_open_w(ma_vfs *pVFS,wchar_t *pFilePath,ma_uint32 openMode,ma_vfs_file *pFile)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if (pFile != (ma_vfs_file *)0x0) {
    *pFile = (ma_vfs_file)0x0;
    if (openMode != 0 && (pFilePath != (wchar_t *)0x0 && pVFS != (ma_vfs *)0x0)) {
      if (*(code **)((long)pVFS + 8) != (code *)0x0) {
        mVar1 = (**(code **)((long)pVFS + 8))();
        return mVar1;
      }
      mVar1 = MA_NOT_IMPLEMENTED;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_vfs_open_w(ma_vfs* pVFS, const wchar_t* pFilePath, ma_uint32 openMode, ma_vfs_file* pFile)
{
    ma_vfs_callbacks* pCallbacks = (ma_vfs_callbacks*)pVFS;

    if (pFile == NULL) {
        return MA_INVALID_ARGS;
    }

    *pFile = NULL;

    if (pVFS == NULL || pFilePath == NULL || openMode == 0) {
        return MA_INVALID_ARGS;
    }

    if (pCallbacks->onOpenW == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    return pCallbacks->onOpenW(pVFS, pFilePath, openMode, pFile);
}